

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O3

int ressc(sunrealtype tres,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  sunrealtype Q [3];
  double dStack_110;
  double local_48;
  double local_40;
  double local_38;
  
  dVar1 = *user_data;
  dVar2 = *(double *)((long)user_data + 8);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar4 = *(double *)((long)user_data + 0x10);
  pdVar18 = (double *)N_VGetArrayPointer();
  pdVar19 = (double *)N_VGetArrayPointer(yp);
  pdVar20 = (double *)N_VGetArrayPointer(rr);
  dVar5 = *pdVar18;
  dVar6 = pdVar18[1];
  dVar7 = pdVar18[2];
  dVar8 = pdVar18[3];
  dVar9 = pdVar18[4];
  dVar10 = pdVar18[5];
  dVar11 = pdVar18[6];
  dVar12 = pdVar18[7];
  dVar13 = pdVar18[8];
  dVar14 = pdVar18[9];
  dVar16 = sin(dVar5);
  dVar5 = cos(dVar5);
  dVar17 = sin(dVar7);
  dVar7 = cos(dVar7);
  force(yy,&local_48,(UserData)user_data);
  dVar21 = dVar1 * dVar16;
  auVar15._8_4_ = SUB84(dVar1,0);
  auVar15._0_8_ = dVar7;
  auVar15._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dVar22 = -dVar1 * dVar5;
  *pdVar20 = dVar22 * dVar14 + dVar21 * dVar13 + (*pdVar19 - dVar8);
  pdVar20[1] = (pdVar19[1] - dVar9) + dVar13;
  pdVar20[2] = dVar14 * -dVar7 + dVar13 * dVar17 + (pdVar19[2] - dVar10);
  pdVar20[3] = dVar22 * dVar12 + dVar21 * dVar11 + (dVar2 * pdVar19[3] - local_48);
  pdVar20[4] = (dVar3 * pdVar19[4] - local_40) + dVar11;
  dStack_110 = auVar15._8_8_;
  pdVar20[5] = (dVar11 * dVar17 + (dVar4 * pdVar19[5] - local_38)) - dVar12 * dVar7;
  pdVar20[6] = (dVar6 - dVar7) - dVar5 * dStack_110;
  pdVar20[7] = dVar16 * -dVar1 + -dVar17;
  pdVar20[8] = dVar10 * dVar17 + dVar21 * dVar8 + dVar9;
  pdVar20[9] = dVar22 * dVar8 + -dVar7 * dVar10;
  return 0;
}

Assistant:

int ressc(sunrealtype tres, N_Vector yy, N_Vector yp, N_Vector rr, void* user_data)
{
  UserData data;
  sunrealtype Q[3];
  sunrealtype a, J1, m2, J2;
  sunrealtype *yval, *ypval, *rval;
  sunrealtype q, x, p;
  sunrealtype qd, xd, pd;
  sunrealtype lam1, lam2, mu1, mu2;
  sunrealtype s1, c1, s2, c2;

  data = (UserData)user_data;

  a  = data->a;
  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  yval  = N_VGetArrayPointer(yy);
  ypval = N_VGetArrayPointer(yp);
  rval  = N_VGetArrayPointer(rr);

  q = yval[0];
  x = yval[1];
  p = yval[2];

  qd = yval[3];
  xd = yval[4];
  pd = yval[5];

  lam1 = yval[6];
  lam2 = yval[7];

  mu1 = yval[8];
  mu2 = yval[9];

  s1 = sin(q);
  c1 = cos(q);
  s2 = sin(p);
  c2 = cos(p);

  force(yy, Q, data);

  rval[0] = ypval[0] - qd + a * s1 * mu1 - a * c1 * mu2;
  rval[1] = ypval[1] - xd + mu1;
  rval[2] = ypval[2] - pd + s2 * mu1 - c2 * mu2;

  rval[3] = J1 * ypval[3] - Q[0] + a * s1 * lam1 - a * c1 * lam2;
  rval[4] = m2 * ypval[4] - Q[1] + lam1;
  rval[5] = J2 * ypval[5] - Q[2] + s2 * lam1 - c2 * lam2;

  rval[6] = x - c2 - a * c1;
  rval[7] = -s2 - a * s1;

  rval[8] = a * s1 * qd + xd + s2 * pd;
  rval[9] = -a * c1 * qd - c2 * pd;

  return (0);
}